

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeRTASParallelOperationJoinExt(ze_rtas_parallel_operation_ext_handle_t hParallelOperation)

{
  ze_result_t zVar1;
  
  if (DAT_0010e130 != (code *)0x0) {
    zVar1 = (*DAT_0010e130)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationJoinExt(
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation  ///< [in] handle of parallel operation object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnJoinExt = context.zeDdiTable.RTASParallelOperation.pfnJoinExt;
        if( nullptr != pfnJoinExt )
        {
            result = pfnJoinExt( hParallelOperation );
        }
        else
        {
            // generic implementation
        }

        return result;
    }